

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<char_const*,long>,phmap::priv::HashEq<char_const*,void>::Hash,phmap::priv::HashEq<char_const*,void>::Eq,std::allocator<std::pair<char_const*const,long>>>
::find_impl<char*>(raw_hash_set<phmap::priv::FlatHashMapPolicy<char_const*,long>,phmap::priv::HashEq<char_const*,void>::Hash,phmap::priv::HashEq<char_const*,void>::Eq,std::allocator<std::pair<char_const*const,long>>>
                   *this,key_arg<char_*> *key,size_t hashval,size_t *offset)

{
  long lVar1;
  h2_t hash;
  bool bVar2;
  size_t sVar3;
  pair<const_char_*const,_long> *ts;
  uint local_84;
  EqualElement<char_*> local_80;
  uint32_t local_70;
  BitMask<unsigned_int,_16,_0> local_6c;
  uint32_t i;
  BitMask<unsigned_int,_16,_0> __end4;
  BitMask<unsigned_int,_16,_0> __begin4;
  BitMask<unsigned_int,_16,_0> *__range4;
  Group g;
  probe_seq<16UL> seq;
  size_t *offset_local;
  size_t hashval_local;
  key_arg<char_*> *key_local;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<const_char_*,_long>,_phmap::priv::HashEq<const_char_*,_void>::Hash,_phmap::priv::HashEq<const_char_*,_void>::Eq,_std::allocator<std::pair<const_char_*const,_long>_>_>
  *this_local;
  
  raw_hash_set<phmap::priv::FlatHashMapPolicy<const_char_*,_long>,_phmap::priv::HashEq<const_char_*,_void>::Hash,_phmap::priv::HashEq<const_char_*,_void>::Eq,_std::allocator<std::pair<const_char_*const,_long>_>_>
  ::probe((probe_seq<16UL> *)(g.ctrl + 1),
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<const_char_*,_long>,_phmap::priv::HashEq<const_char_*,_void>::Hash,_phmap::priv::HashEq<const_char_*,_void>::Eq,_std::allocator<std::pair<const_char_*const,_long>_>_>
           *)this,hashval);
  do {
    lVar1 = *(long *)this;
    sVar3 = probe_seq<16UL>::offset((probe_seq<16UL> *)(g.ctrl + 1));
    GroupSse2Impl::GroupSse2Impl((GroupSse2Impl *)&__range4,(ctrl_t *)(lVar1 + sVar3));
    hash = H2(hashval);
    __end4 = GroupSse2Impl::Match((GroupSse2Impl *)&__range4,hash);
    i = (uint32_t)BitMask<unsigned_int,_16,_0>::begin(&__end4);
    local_6c = BitMask<unsigned_int,_16,_0>::end(&__end4);
    while (bVar2 = operator!=((BitMask<unsigned_int,_16,_0> *)&i,&local_6c), bVar2) {
      local_70 = BitMask<unsigned_int,_16,_0>::operator*((BitMask<unsigned_int,_16,_0> *)&i);
      sVar3 = probe_seq<16UL>::offset((probe_seq<16UL> *)(g.ctrl + 1),(ulong)local_70);
      *offset = sVar3;
      local_80.rhs = key;
      local_80.eq = raw_hash_set<phmap::priv::FlatHashMapPolicy<const_char_*,_long>,_phmap::priv::HashEq<const_char_*,_void>::Hash,_phmap::priv::HashEq<const_char_*,_void>::Eq,_std::allocator<std::pair<const_char_*const,_long>_>_>
                    ::eq_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<const_char_*,_long>,_phmap::priv::HashEq<const_char_*,_void>::Hash,_phmap::priv::HashEq<const_char_*,_void>::Eq,_std::allocator<std::pair<const_char_*const,_long>_>_>
                              *)this);
      ts = hash_policy_traits<phmap::priv::FlatHashMapPolicy<char_const*,long>,void>::
           element<phmap::priv::FlatHashMapPolicy<char_const*,long>>
                     ((slot_type *)(*(long *)(this + 8) + *offset * 0x10));
      bVar2 = hash_policy_traits<phmap::priv::FlatHashMapPolicy<char_const*,long>,void>::
              apply<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<char_const*,long>,phmap::priv::HashEq<char_const*,void>::Hash,phmap::priv::HashEq<char_const*,void>::Eq,std::allocator<std::pair<char_const*const,long>>>::EqualElement<char*>,std::pair<char_const*const,long>&,phmap::priv::FlatHashMapPolicy<char_const*,long>>
                        (&local_80,ts);
      if (bVar2) {
        return true;
      }
      BitMask<unsigned_int,_16,_0>::operator++((BitMask<unsigned_int,_16,_0> *)&i);
    }
    local_84 = (uint)GroupSse2Impl::MatchEmpty((GroupSse2Impl *)&__range4);
    bVar2 = BitMask::operator_cast_to_bool((BitMask *)&local_84);
    if (bVar2) {
      return false;
    }
    probe_seq<16UL>::next((probe_seq<16UL> *)(g.ctrl + 1));
  } while( true );
}

Assistant:

bool find_impl(const key_arg<K>& PHMAP_RESTRICT key, size_t hashval, size_t& PHMAP_RESTRICT offset) {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return false;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ ctrl_ + seq.offset() };
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                offset = seq.offset((size_t)i);
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                    EqualElement<K>{key, eq_ref()},
                    PolicyTraits::element(slots_ + offset))))
                    return true;
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty()))
                return false;
            seq.next();
        }
    }